

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::emit_header(CompilerGLSL *this)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  uint uVar1;
  Precision PVar2;
  size_t sVar3;
  ulong uVar4;
  Capability *pCVar5;
  undefined8 uVar6;
  int iVar7;
  SPIREntryPoint *pSVar8;
  size_type sVar9;
  CompilerError *this_01;
  uint *z;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  SpecializationConstant SVar10;
  char *ts;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_02;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  ShaderSubgroupSupportHelper *this_03;
  bool bVar14;
  char *extra_predicate;
  char *name;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  outputs;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  extra_names;
  SpecializationConstant local_13c0;
  SpecializationConstant local_13b8;
  undefined1 local_13a8 [32];
  ShaderSubgroupSupportHelper *local_1388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1380;
  char *local_1378;
  char *local_1370;
  undefined1 local_1368 [288];
  undefined1 local_1248 [288];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  pSVar8 = Compiler::get_entry_point(&this->super_Compiler);
  local_1128._0_8_ = " es";
  if ((this->options).version < 0x65) {
    local_1128._0_8_ = (long)"==================\n\n" + 0x14;
  }
  if ((this->options).es == false) {
    local_1128._0_8_ = (long)"==================\n\n" + 0x14;
  }
  statement<char_const(&)[10],unsigned_int&,char_const*>
            (this,(char (*) [10])"#version ",&(this->options).version,(char **)local_1128);
  if (((this->options).es == false) && ((this->options).version < 0x1a4)) {
    if ((this->options).enable_420pack_extension == true) {
      statement<char_const(&)[39]>(this,(char (*) [39])"#ifdef GL_ARB_shading_language_420pack");
      statement<char_const(&)[53]>
                (this,(char (*) [53])"#extension GL_ARB_shading_language_420pack : require");
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    if (((pSVar8->flags).lower & 0x200) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_ARB_shader_image_load_store","");
      require_extension_internal(this,(string *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
  }
  local_1128._0_4_ = 0x115e;
  this_00 = &(pSVar8->flags).higher;
  sVar9 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this_00->_M_h,(key_type *)local_1128);
  if (sVar9 != 0) {
    local_1128._0_8_ = (long)local_1128 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1128,"GL_ARB_post_depth_coverage","");
    require_extension_internal(this,(string *)local_1128);
    if (local_1128._0_8_ != (long)local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  local_1128._0_4_ = 0x14f6;
  sVar9 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this_00->_M_h,(key_type *)local_1128);
  bVar14 = true;
  if (sVar9 == 0) {
    local_1128._0_4_ = 0x14f7;
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,(key_type *)local_1128);
    if (sVar9 == 0) {
      local_1128._0_4_ = 0x14f8;
      sVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,(key_type *)local_1128);
      if (sVar9 == 0) {
        local_1128._0_4_ = 0x14f9;
        sVar9 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&this_00->_M_h,(key_type *)local_1128);
        bVar14 = sVar9 != 0;
      }
    }
  }
  if (bVar14) {
    uVar1 = (this->options).version;
    if ((this->options).es == true) {
      if (uVar1 < 0x136) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_01,"At least ESSL 3.10 required for fragment shader interlock.");
        __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_NV_fragment_shader_interlock","");
      require_extension_internal(this,(string *)local_1128);
    }
    else {
      if (uVar1 < 0x1a4) {
        local_1128._0_8_ = (long)local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"GL_ARB_shader_image_load_store","");
        require_extension_internal(this,(string *)local_1128);
        if (local_1128._0_8_ != (long)local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_ARB_fragment_shader_interlock","");
      require_extension_internal(this,(string *)local_1128);
    }
    if (local_1128._0_8_ != (long)local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  sVar3 = (this->forced_extensions).
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size;
  local_13a8._24_8_ = pSVar8;
  if (sVar3 != 0) {
    pbVar13 = (this->forced_extensions).
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr;
    lVar11 = sVar3 << 5;
    do {
      iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
      if (iVar7 == 0) {
        statement<char_const(&)[37]>(this,(char (*) [37])"#if defined(GL_ARB_gpu_shader_int64)");
        statement<char_const(&)[45]>
                  (this,(char (*) [45])"#extension GL_ARB_gpu_shader_int64 : require");
        if (((this->options).vulkan_semantics != true) || ((this->options).es == true)) {
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
        }
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        statement<char_const(&)[51]>
                  (this,(char (*) [51])"#error No extension available for 64-bit integers.");
        goto LAB_0012397a;
      }
      iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
      if (iVar7 == 0) {
        statement<char_const(&)[42]>
                  (this,(char (*) [42])"#if defined(GL_AMD_gpu_shader_half_float)");
        statement<char_const(&)[50]>
                  (this,(char (*) [50])"#extension GL_AMD_gpu_shader_half_float : require");
        if ((this->options).vulkan_semantics == false) {
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
        }
        else {
          statement<char_const(&)[63]>
                    (this,(char (*) [63])
                          "#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
          statement<char_const(&)[69]>
                    (this,(char (*) [69])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
        }
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        ts = "#error No extension available for FP16.";
LAB_00123975:
        statement<char_const(&)[40]>(this,(char (*) [40])ts);
LAB_0012397a:
        statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
      }
      else {
        iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
        if (iVar7 == 0) {
          if ((this->options).vulkan_semantics == true) {
            statement<char_const(&)[66]>
                      (this,(char (*) [66])
                            "#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
            goto LAB_00123985;
          }
          statement<char_const(&)[58]>
                    (this,(char (*) [58])"#if defined(GL_EXT_shader_explicit_arithmetic_types_int8)"
                    );
          statement<char_const(&)[66]>
                    (this,(char (*) [66])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          ts = "#error No extension available for Int8.";
          goto LAB_00123975;
        }
        iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
        if (iVar7 == 0) {
          if ((this->options).vulkan_semantics == true) {
            statement<char_const(&)[67]>
                      (this,(char (*) [67])
                            "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
            goto LAB_00123985;
          }
          statement<char_const(&)[59]>
                    (this,(char (*) [59])
                          "#if defined(GL_EXT_shader_explicit_arithmetic_types_int16)");
          statement<char_const(&)[67]>
                    (this,(char (*) [67])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
          statement<char_const(&)[39]>(this,(char (*) [39])"#elif defined(GL_AMD_gpu_shader_int16)")
          ;
          statement<char_const(&)[45]>
                    (this,(char (*) [45])"#extension GL_AMD_gpu_shader_int16 : require");
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          statement<char_const(&)[41]>
                    (this,(char (*) [41])"#error No extension available for Int16.");
          goto LAB_0012397a;
        }
        iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
        if (iVar7 == 0) {
          if ((this->options).es == true) {
            statement<char_const(&)[48]>
                      (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
            goto LAB_00123985;
          }
          statement<char_const(&)[39]>(this,(char (*) [39])"#if defined(GL_ARB_post_depth_coverge)")
          ;
          statement<char_const(&)[48]>
                    (this,(char (*) [48])"#extension GL_ARB_post_depth_coverage : require");
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          statement<char_const(&)[48]>
                    (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
          goto LAB_0012397a;
        }
        if (((this->options).vulkan_semantics == false) &&
           (iVar7 = ::std::__cxx11::string::compare((char *)pbVar13), iVar7 == 0)) {
          statement<char_const(&)[8],std::__cxx11::string&>(this,(char (*) [8])"#ifdef ",pbVar13);
          statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[10]>
                    (this,(char (*) [12])"#extension ",pbVar13,(char (*) [10])0x2b49d3);
          goto LAB_0012397a;
        }
        iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
        if (iVar7 == 0) {
          statement<char_const(&)[44]>
                    (this,(char (*) [44])"#if defined(GL_EXT_control_flow_attributes)");
          statement<char_const(&)[52]>
                    (this,(char (*) [52])"#extension GL_EXT_control_flow_attributes : require");
          statement<char_const(&)[40]>
                    (this,(char (*) [40])"#define SPIRV_CROSS_FLATTEN [[flatten]]");
          statement<char_const(&)[44]>
                    (this,(char (*) [44])"#define SPIRV_CROSS_BRANCH [[dont_flatten]]");
          statement<char_const(&)[38]>(this,(char (*) [38])"#define SPIRV_CROSS_UNROLL [[unroll]]");
          statement<char_const(&)[41]>
                    (this,(char (*) [41])"#define SPIRV_CROSS_LOOP [[dont_unroll]]");
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          statement<char_const(&)[28]>(this,(char (*) [28])"#define SPIRV_CROSS_FLATTEN");
          statement<char_const(&)[27]>(this,(char (*) [27])"#define SPIRV_CROSS_BRANCH");
          statement<char_const(&)[27]>(this,(char (*) [27])"#define SPIRV_CROSS_UNROLL");
          statement<char_const(&)[25]>(this,(char (*) [25])"#define SPIRV_CROSS_LOOP");
          goto LAB_0012397a;
        }
        iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
        if (iVar7 == 0) {
          statement<char_const(&)[53]>
                    (this,(char (*) [53])"#extension GL_NV_fragment_shader_interlock : require");
          statement<char_const(&)[76]>
                    (this,(char (*) [76])
                          "#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockNV()"
                    );
          statement<char_const(&)[72]>
                    (this,(char (*) [72])
                          "#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockNV()")
          ;
        }
        else {
          iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
          if (iVar7 == 0) {
            statement<char_const(&)[40]>
                      (this,(char (*) [40])"#ifdef GL_ARB_fragment_shader_interlock");
            statement<char_const(&)[53]>
                      (this,(char (*) [53])"#extension GL_ARB_fragment_shader_interlock : enable");
            statement<char_const(&)[77]>
                      (this,(char (*) [77])
                            "#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockARB()"
                      );
            statement<char_const(&)[73]>
                      (this,(char (*) [73])
                            "#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockARB()"
                      );
            statement<char_const(&)[49]>
                      (this,(char (*) [49])"#elif defined(GL_INTEL_fragment_shader_ordering)");
            statement<char_const(&)[54]>
                      (this,(char (*) [54])"#extension GL_INTEL_fragment_shader_ordering : enable");
            statement<char_const(&)[82]>
                      (this,(char (*) [82])
                            "#define SPIRV_Cross_beginInvocationInterlock() beginFragmentShaderOrderingINTEL()"
                      );
            statement<char_const(&)[45]>
                      (this,(char (*) [45])"#define SPIRV_Cross_endInvocationInterlock()");
            goto LAB_0012397a;
          }
          statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[11]>
                    (this,(char (*) [12])"#extension ",pbVar13,(char (*) [11])0x2b41d4);
        }
      }
LAB_00123985:
      pbVar13 = pbVar13 + 1;
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != 0);
  }
  if ((this->options).vulkan_semantics == false) {
    this_03 = &this->shader_subgroup_supporter;
    ShaderSubgroupSupportHelper::resolve((Result *)local_1248,this_03);
    lVar11 = 0;
    local_1388 = this_03;
    do {
      if ((this_03->feature_mask >> ((Feature)lVar11 & (FeatureCount|SubgroupID)) & 1) != 0) {
        local_13a8._16_8_ = lVar11;
        ShaderSubgroupSupportHelper::get_candidates_for_feature
                  ((CandidateVector *)local_1368,(Feature)lVar11,(Result *)local_1248);
        if (local_1368._8_8_ != 0) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x2b1c7b);
          if (local_1368._8_8_ != 0) {
            local_1380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_1368._0_8_)->_M_p + local_1368._8_8_ * 4);
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1368._0_8_;
            do {
              local_13b8 = *(SpecializationConstant *)
                            (ShaderSubgroupSupportHelper::get_extension_name::retval +
                            *(uint *)&(pbVar13->_M_dataplus)._M_p);
              iVar7 = *(int *)&(pbVar13->_M_dataplus)._M_p;
              local_13c0 = (SpecializationConstant)((long)"==================\n\n" + 0x14);
              if (iVar7 == 9) {
                local_13c0 = (SpecializationConstant)0x2bdf0f;
              }
              if (iVar7 == 7) {
                local_13c0 = (SpecializationConstant)0x2bdef2;
              }
              ShaderSubgroupSupportHelper::get_extra_required_extension_names_abi_cxx11_
                        ((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                          *)local_1128,
                         (ShaderSubgroupSupportHelper *)(ulong)*(uint *)&(pbVar13->_M_dataplus)._M_p
                         ,0x2bdf0f);
              local_1370 = "#elif";
              if (pbVar13 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1368._0_8_) {
                local_1370 = "#if";
              }
              local_1378 = " && ";
              if (*(char *)local_13c0 == '\0') {
                local_1378 = "";
              }
              statement<char_const*,char_const(&)[10],char_const*&,char_const(&)[2],char_const*,char_const*&>
                        (this,&local_1370,(char (*) [10])" defined(",(char **)&local_13b8,
                         (char (*) [2])0x2bd856,&local_1378,(char **)&local_13c0);
              if (local_1128._8_8_ != 0) {
                lVar11 = local_1128._8_8_ << 5;
                SVar10 = (SpecializationConstant)local_1128._0_8_;
                do {
                  statement<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[10]>
                            (this,(char (*) [12])"#extension ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             SVar10,(char (*) [10])0x2b49d3);
                  SVar10 = (SpecializationConstant)((long)SVar10 + 0x20);
                  lVar11 = lVar11 + -0x20;
                } while (lVar11 != 0);
              }
              statement<char_const(&)[12],char_const*&,char_const(&)[11]>
                        (this,(char (*) [12])"#extension ",(char **)&local_13b8,
                         (char (*) [11])0x2b41d4);
              SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
              ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                              *)local_1128);
              pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar13->_M_dataplus)._M_p + 4);
            } while (pbVar13 != local_1380);
          }
          this_03 = local_1388;
          if (ShaderSubgroupSupportHelper::can_feature_be_implemented_without_extensions::retval
              [local_13a8._16_8_] == false) {
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[70]>
                      (this,(char (*) [70])
                            "#error No extensions available to emulate requested subgroup feature.")
            ;
          }
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
        }
        local_1368._8_8_ = 0;
        lVar11 = local_13a8._16_8_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1368._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1368 + 0x18)
           ) {
          free((void *)local_1368._0_8_);
          lVar11 = local_13a8._16_8_;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x1c);
  }
  uVar6 = local_13a8._24_8_;
  sVar3 = (this->header_lines).
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size;
  if (sVar3 != 0) {
    pbVar13 = (this->header_lines).
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr;
    lVar11 = sVar3 << 5;
    do {
      statement<std::__cxx11::string&>(this,pbVar13);
      pbVar13 = pbVar13 + 1;
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != 0);
  }
  local_1368._0_8_ = local_1368 + 0x18;
  local_1368._8_8_ = 0;
  local_1368._16_8_ = 8;
  local_1248._0_8_ = local_1248 + 0x18;
  local_1248._8_8_ = 0;
  local_1248._16_8_ = 8;
  z = &switchD_00123ec3::switchdataD_002b1e40;
  switch(*(ExecutionModel *)(uVar6 + 0xe8)) {
  case ExecutionModelVertex:
    if ((this->options).ovr_multiview_view_count == 0) goto LAB_00124b91;
    join<char_const(&)[13],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"num_views = ",
               (char (*) [13])&(this->options).ovr_multiview_view_count,
               &switchD_00123ec3::switchdataD_002b1e40);
    this_02 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_1368;
    break;
  case ExecutionModelTessellationControl:
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x4000000) == 0) goto LAB_00124b91;
    join<char_const(&)[12],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)0x2b4b10,(char (*) [12])(uVar6 + 0xe0),
               &switchD_00123ec3::switchdataD_002b1e40);
    this_02 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_1248;
    break;
  case ExecutionModelTessellationEvaluation:
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x1000000) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"quads","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x400000) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"triangles","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x2000000) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"isolines","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x400) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"point_mode","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    uVar4 = ((Bitset *)(uVar6 + 0x80))->lower;
    if (((uint)uVar4 >> 0x19 & 1) == 0) {
      if ((uVar4 & 0x10) != 0) {
        local_1128._0_8_ = (long)local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"cw","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1368,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128._0_8_ != (long)local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      if ((((Bitset *)(uVar6 + 0x80))->lower & 0x20) != 0) {
        local_1128._0_8_ = (long)local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"ccw","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1368,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128._0_8_ != (long)local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 4) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"fractional_even_spacing","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 8) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"fractional_odd_spacing","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 2) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"equal_spacing","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    goto LAB_00124b91;
  case ExecutionModelGeometry:
    if (((((Bitset *)(uVar6 + 0x80))->lower & 1) != 0) && (*(uint32_t *)(uVar6 + 0xdc) != 1)) {
      join<char_const(&)[15],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"invocations = ",(char (*) [15])(uVar6 + 0xdc),
                 &switchD_00123ec3::switchdataD_002b1e40);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x80000) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"points","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x100000) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"lines","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x200000) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"lines_adjacency","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x400000) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"triangles","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x800000) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"triangles_adjacency","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if (*(bool *)(uVar6 + 0xec) != false) goto LAB_00124b91;
    join<char_const(&)[16],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"max_vertices = ",(char (*) [16])(uVar6 + 0xe0),z
              );
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    SVar10 = (SpecializationConstant)((long)local_1128 + 0x10);
    if ((SpecializationConstant)local_1128._0_8_ != SVar10) {
      operator_delete((void *)local_1128._0_8_);
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x20000000) != 0) {
      local_1128._0_8_ = SVar10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"triangle_strip","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((SpecializationConstant)local_1128._0_8_ != SVar10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x8000000) != 0) {
      local_1128._0_8_ = SVar10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"points","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((SpecializationConstant)local_1128._0_8_ != SVar10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x10000000) == 0) goto LAB_00124b91;
    local_1128._0_8_ = SVar10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"line_strip","");
    goto LAB_001248ec;
  case ExecutionModelFragment:
    if ((this->options).es == true) {
      PVar2 = (this->options).fragment.default_float_precision;
      if (PVar2 == Highp) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision highp float;");
      }
      else if (PVar2 == Mediump) {
        statement<char_const(&)[25]>(this,(char (*) [25])"precision mediump float;");
      }
      else if (PVar2 == Lowp) {
        statement<char_const(&)[22]>(this,(char (*) [22])"precision lowp float;");
      }
      PVar2 = (this->options).fragment.default_int_precision;
      if (PVar2 == Highp) {
        statement<char_const(&)[21]>(this,(char (*) [21])"precision highp int;");
      }
      else if (PVar2 == Mediump) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision mediump int;");
      }
      else if (PVar2 == Lowp) {
        statement<char_const(&)[20]>(this,(char (*) [20])"precision lowp int;");
      }
    }
    if ((((Bitset *)(uVar6 + 0x80))->lower & 0x200) != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"early_fragment_tests","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    local_1128._0_4_ = 0x115e;
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,(key_type *)local_1128);
    if (sVar9 != 0) {
      local_1128._0_8_ = (long)local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"post_depth_coverage","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128._0_8_ != (long)local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    if (bVar14) {
      statement<char_const(&)[46]>
                (this,(char (*) [46])"#if defined(GL_ARB_fragment_shader_interlock)");
    }
    local_1128._0_4_ = 0x14f6;
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,(key_type *)local_1128);
    if (sVar9 == 0) {
      local_1128._0_4_ = 0x14f7;
      sVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,(key_type *)local_1128);
      if (sVar9 == 0) {
        local_1128._0_4_ = 0x14f8;
        sVar9 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&this_00->_M_h,(key_type *)local_1128);
        if (sVar9 == 0) {
          local_1128._0_4_ = 0x14f9;
          sVar9 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&this_00->_M_h,(key_type *)local_1128);
          if (sVar9 != 0) {
            statement<char_const(&)[39]>
                      (this,(char (*) [39])"layout(sample_interlock_unordered) in;");
          }
        }
        else {
          statement<char_const(&)[37]>(this,(char (*) [37])"layout(sample_interlock_ordered) in;");
        }
      }
      else {
        statement<char_const(&)[38]>(this,(char (*) [38])"layout(pixel_interlock_unordered) in;");
      }
    }
    else {
      statement<char_const(&)[36]>(this,(char (*) [36])"layout(pixel_interlock_ordered) in;");
    }
    if (bVar14) {
      statement<char_const(&)[50]>
                (this,(char (*) [50])"#elif !defined(GL_INTEL_fragment_shader_ordering)");
      statement<char_const(&)[61]>
                (this,(char (*) [61])"#error Fragment Shader Interlock/Ordering extension missing!")
      ;
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    if ((this->options).es == false) {
      if ((((Bitset *)(uVar6 + 0x80))->lower & 0x4000) == 0) {
        if ((((Bitset *)(uVar6 + 0x80))->lower & 0x8000) != 0) {
          statement<char_const(&)[43]>
                    (this,(char (*) [43])"layout(depth_less) out float gl_FragDepth;");
        }
      }
      else {
        statement<char_const(&)[46]>
                  (this,(char (*) [46])"layout(depth_greater) out float gl_FragDepth;");
      }
    }
    goto LAB_00124b91;
  case ExecutionModelGLCompute:
    goto switchD_00123ec3_caseD_5;
  default:
    z = (uint *)(SpecializationConstant *)0x8;
    if (1 < *(ExecutionModel *)(uVar6 + 0xe8) - ExecutionModelTaskEXT) goto LAB_00124b91;
switchD_00123ec3_caseD_5:
    if ((((WorkgroupSize *)(uVar6 + 0xc0))->constant == 0) &&
       ((((Bitset *)(uVar6 + 0x80))->lower & 0x4000000000) == 0)) {
      join<char_const(&)[16],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"local_size_x = ",(char (*) [16])(uVar6 + 0xc0)
                 ,z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      SVar10 = (SpecializationConstant)((long)local_1128 + 0x10);
      if ((SpecializationConstant)local_1128._0_8_ != SVar10) {
        operator_delete((void *)local_1128._0_8_);
      }
      join<char_const(&)[16],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&((WorkgroupSize *)(uVar6 + 0xc0))->y,z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((SpecializationConstant)local_1128._0_8_ != SVar10) {
        operator_delete((void *)local_1128._0_8_);
      }
      join<char_const(&)[16],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"local_size_z = ",
                 (char (*) [16])&((WorkgroupSize *)(uVar6 + 0xc0))->z,z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1368,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((SpecializationConstant)local_1128._0_8_ != SVar10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    else {
      local_1128._0_8_ = local_1128._0_8_ & 0xffffffff00000000;
      local_13b8 = (SpecializationConstant)((ulong)local_13b8 & 0xffffffff00000000);
      z = (uint *)&local_13c0;
      local_13c0 = (SpecializationConstant)((ulong)local_13c0 & 0xffffffff00000000);
      Compiler::get_work_group_size_specialization_constants
                (&this->super_Compiler,(SpecializationConstant *)local_1128,&local_13b8,
                 (SpecializationConstant *)z);
      if (((this->options).vulkan_semantics != false) ||
         (((local_1128._0_4_ == 0 && (local_13b8.id.id == 0)) && (local_13c0.id.id == 0)))) {
        z = (uint *)&local_13b8;
        build_workgroup_size
                  (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_1368,(SpecializationConstant *)local_1128,
                   (SpecializationConstant *)z,&local_13c0);
      }
    }
    if (*(ExecutionModel *)(uVar6 + 0xe8) != ExecutionModelMeshEXT) goto LAB_00124b91;
    join<char_const(&)[16],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"max_vertices = ",(char (*) [16])(uVar6 + 0xe0),z
              );
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    SVar10 = (SpecializationConstant)((long)local_1128 + 0x10);
    if ((SpecializationConstant)local_1128._0_8_ != SVar10) {
      operator_delete((void *)local_1128._0_8_);
    }
    join<char_const(&)[18],unsigned_int&>
              ((string *)local_1128,(spirv_cross *)"max_primitives = ",(char (*) [18])(uVar6 + 0xe4)
               ,z);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((SpecializationConstant)local_1128._0_8_ != SVar10) {
      operator_delete((void *)local_1128._0_8_);
    }
    local_1128._0_4_ = 0x14b2;
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,(key_type *)local_1128);
    if (sVar9 == 0) {
      local_1128._0_4_ = 0x1495;
      sVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,(key_type *)local_1128);
      if (sVar9 == 0) {
        if ((((Bitset *)(uVar6 + 0x80))->lower & 0x8000000) == 0) goto LAB_00124b91;
        local_1128._0_8_ = SVar10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"points","");
      }
      else {
        local_1128._0_8_ = SVar10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"lines","");
      }
    }
    else {
      local_1128._0_8_ = SVar10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"triangles","");
    }
LAB_001248ec:
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if (local_1128._0_8_ == (long)local_1128 + 0x10) goto LAB_00124b91;
    goto LAB_00124910;
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1128);
  if (local_1128._0_8_ != (long)local_1128 + 0x10) {
LAB_00124910:
    operator_delete((void *)local_1128._0_8_);
  }
LAB_00124b91:
  sVar3 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.
          buffer_size;
  if (sVar3 != 0) {
    pCVar5 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.ptr;
    lVar11 = 0;
    do {
      if (*(int *)((long)pCVar5 + lVar11) == 0x117e) {
        statement<char_const(&)[27]>(this,(char (*) [27])"layout(primitive_culling);");
      }
      lVar11 = lVar11 + 4;
    } while (sVar3 << 2 != lVar11);
  }
  if (local_1368._8_8_ != 0) {
    local_110 = local_f8;
    local_1128._0_4_ = 0;
    local_1128._4_4_ = 0;
    local_1128._8_8_ = 0;
    local_1128._16_8_ = 0;
    sStack_108 = 0;
    local_100 = 8;
    StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
    if (local_1368._8_8_ != 0) {
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1368._0_8_ + local_1368._8_8_ * 0x20);
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1368._0_8_;
      do {
        StringStream<4096UL,_4096UL>::append
                  ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar13->_M_dataplus)._M_p,
                   pbVar13->_M_string_length);
        if (pbVar13 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_1368._0_8_ + (local_1368._8_8_ - 1) * 0x20)) {
          StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != pbVar12);
    }
    StringStream<4096ul,4096ul>::str_abi_cxx11_((string *)&local_13b8,local_1128);
    StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_13b8,
               (char (*) [6])0x2b4cd5);
    if (local_13b8 != (SpecializationConstant)local_13a8) {
      operator_delete((void *)local_13b8);
    }
  }
  if (local_1248._8_8_ != 0) {
    local_110 = local_f8;
    local_1128._0_4_ = 0;
    local_1128._4_4_ = 0;
    local_1128._8_8_ = 0;
    local_1128._16_8_ = 0;
    sStack_108 = 0;
    local_100 = 8;
    StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
    if (local_1248._8_8_ != 0) {
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1248._0_8_ + local_1248._8_8_ * 0x20);
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1248._0_8_;
      do {
        StringStream<4096UL,_4096UL>::append
                  ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar13->_M_dataplus)._M_p,
                   pbVar13->_M_string_length);
        if (pbVar13 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_1248._0_8_ + (local_1248._8_8_ - 1) * 0x20)) {
          StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != pbVar12);
    }
    StringStream<4096ul,4096ul>::str_abi_cxx11_((string *)&local_13b8,local_1128);
    StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[7]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_13b8,
               (char (*) [7])") out;");
    if (local_13b8 != (SpecializationConstant)local_13a8) {
      operator_delete((void *)local_13b8);
    }
  }
  statement<char_const(&)[1]>(this,(char (*) [1])0x2b1c7b);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1248);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1368);
  return;
}

Assistant:

void CompilerGLSL::emit_header()
{
	auto &execution = get_entry_point();
	statement("#version ", options.version, options.es && options.version > 100 ? " es" : "");

	if (!options.es && options.version < 420)
	{
		// Needed for binding = # on UBOs, etc.
		if (options.enable_420pack_extension)
		{
			statement("#ifdef GL_ARB_shading_language_420pack");
			statement("#extension GL_ARB_shading_language_420pack : require");
			statement("#endif");
		}
		// Needed for: layout(early_fragment_tests) in;
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			require_extension_internal("GL_ARB_shader_image_load_store");
	}

	// Needed for: layout(post_depth_coverage) in;
	if (execution.flags.get(ExecutionModePostDepthCoverage))
		require_extension_internal("GL_ARB_post_depth_coverage");

	// Needed for: layout({pixel,sample}_interlock_[un]ordered) in;
	bool interlock_used = execution.flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	                      execution.flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	                      execution.flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	                      execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT);

	if (interlock_used)
	{
		if (options.es)
		{
			if (options.version < 310)
				SPIRV_CROSS_THROW("At least ESSL 3.10 required for fragment shader interlock.");
			require_extension_internal("GL_NV_fragment_shader_interlock");
		}
		else
		{
			if (options.version < 420)
				require_extension_internal("GL_ARB_shader_image_load_store");
			require_extension_internal("GL_ARB_fragment_shader_interlock");
		}
	}

	for (auto &ext : forced_extensions)
	{
		if (ext == "GL_ARB_gpu_shader_int64")
		{
			statement("#if defined(GL_ARB_gpu_shader_int64)");
			statement("#extension GL_ARB_gpu_shader_int64 : require");
			if (!options.vulkan_semantics || options.es)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			statement("#else");
			statement("#error No extension available for 64-bit integers.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_float16")
		{
			// Special case, this extension has a potential fallback to another vendor extension in normal GLSL.
			// GL_AMD_gpu_shader_half_float is a superset, so try that first.
			statement("#if defined(GL_AMD_gpu_shader_half_float)");
			statement("#extension GL_AMD_gpu_shader_half_float : require");
			if (!options.vulkan_semantics)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			else
			{
				statement("#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
			}
			statement("#else");
			statement("#error No extension available for FP16.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int8")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
			else
			{
				statement("#if defined(GL_EXT_shader_explicit_arithmetic_types_int8)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
				statement("#else");
				statement("#error No extension available for Int8.");
				statement("#endif");
			}
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int16")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
			else
			{
				statement("#if defined(GL_EXT_shader_explicit_arithmetic_types_int16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
				statement("#elif defined(GL_AMD_gpu_shader_int16)");
				statement("#extension GL_AMD_gpu_shader_int16 : require");
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
				statement("#else");
				statement("#error No extension available for Int16.");
				statement("#endif");
			}
		}
		else if (ext == "GL_ARB_post_depth_coverage")
		{
			if (options.es)
				statement("#extension GL_EXT_post_depth_coverage : require");
			else
			{
				statement("#if defined(GL_ARB_post_depth_coverge)");
				statement("#extension GL_ARB_post_depth_coverage : require");
				statement("#else");
				statement("#extension GL_EXT_post_depth_coverage : require");
				statement("#endif");
			}
		}
		else if (!options.vulkan_semantics && ext == "GL_ARB_shader_draw_parameters")
		{
			// Soft-enable this extension on plain GLSL.
			statement("#ifdef ", ext);
			statement("#extension ", ext, " : enable");
			statement("#endif");
		}
		else if (ext == "GL_EXT_control_flow_attributes")
		{
			// These are just hints so we can conditionally enable and fallback in the shader.
			statement("#if defined(GL_EXT_control_flow_attributes)");
			statement("#extension GL_EXT_control_flow_attributes : require");
			statement("#define SPIRV_CROSS_FLATTEN [[flatten]]");
			statement("#define SPIRV_CROSS_BRANCH [[dont_flatten]]");
			statement("#define SPIRV_CROSS_UNROLL [[unroll]]");
			statement("#define SPIRV_CROSS_LOOP [[dont_unroll]]");
			statement("#else");
			statement("#define SPIRV_CROSS_FLATTEN");
			statement("#define SPIRV_CROSS_BRANCH");
			statement("#define SPIRV_CROSS_UNROLL");
			statement("#define SPIRV_CROSS_LOOP");
			statement("#endif");
		}
		else if (ext == "GL_NV_fragment_shader_interlock")
		{
			statement("#extension GL_NV_fragment_shader_interlock : require");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockNV()");
			statement("#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockNV()");
		}
		else if (ext == "GL_ARB_fragment_shader_interlock")
		{
			statement("#ifdef GL_ARB_fragment_shader_interlock");
			statement("#extension GL_ARB_fragment_shader_interlock : enable");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockARB()");
			statement("#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockARB()");
			statement("#elif defined(GL_INTEL_fragment_shader_ordering)");
			statement("#extension GL_INTEL_fragment_shader_ordering : enable");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginFragmentShaderOrderingINTEL()");
			statement("#define SPIRV_Cross_endInvocationInterlock()");
			statement("#endif");
		}
		else
			statement("#extension ", ext, " : require");
	}

	if (!options.vulkan_semantics)
	{
		using Supp = ShaderSubgroupSupportHelper;
		auto result = shader_subgroup_supporter.resolve();

		for (uint32_t feature_index = 0; feature_index < Supp::FeatureCount; feature_index++)
		{
			auto feature = static_cast<Supp::Feature>(feature_index);
			if (!shader_subgroup_supporter.is_feature_requested(feature))
				continue;

			auto exts = Supp::get_candidates_for_feature(feature, result);
			if (exts.empty())
				continue;

			statement("");

			for (auto &ext : exts)
			{
				const char *name = Supp::get_extension_name(ext);
				const char *extra_predicate = Supp::get_extra_required_extension_predicate(ext);
				auto extra_names = Supp::get_extra_required_extension_names(ext);
				statement(&ext != &exts.front() ? "#elif" : "#if", " defined(", name, ")",
				          (*extra_predicate != '\0' ? " && " : ""), extra_predicate);
				for (const auto &e : extra_names)
					statement("#extension ", e, " : enable");
				statement("#extension ", name, " : require");
			}

			if (!Supp::can_feature_be_implemented_without_extensions(feature))
			{
				statement("#else");
				statement("#error No extensions available to emulate requested subgroup feature.");
			}

			statement("#endif");
		}
	}

	for (auto &header : header_lines)
		statement(header);

	SmallVector<string> inputs;
	SmallVector<string> outputs;

	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (options.ovr_multiview_view_count)
			inputs.push_back(join("num_views = ", options.ovr_multiview_view_count));
		break;
	case ExecutionModelGeometry:
		if ((execution.flags.get(ExecutionModeInvocations)) && execution.invocations != 1)
			inputs.push_back(join("invocations = ", execution.invocations));
		if (execution.flags.get(ExecutionModeInputPoints))
			inputs.push_back("points");
		if (execution.flags.get(ExecutionModeInputLines))
			inputs.push_back("lines");
		if (execution.flags.get(ExecutionModeInputLinesAdjacency))
			inputs.push_back("lines_adjacency");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeInputTrianglesAdjacency))
			inputs.push_back("triangles_adjacency");

		if (!execution.geometry_passthrough)
		{
			// For passthrough, these are implies and cannot be declared in shader.
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			if (execution.flags.get(ExecutionModeOutputTriangleStrip))
				outputs.push_back("triangle_strip");
			if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
			if (execution.flags.get(ExecutionModeOutputLineStrip))
				outputs.push_back("line_strip");
		}
		break;

	case ExecutionModelTessellationControl:
		if (execution.flags.get(ExecutionModeOutputVertices))
			outputs.push_back(join("vertices = ", execution.output_vertices));
		break;

	case ExecutionModelTessellationEvaluation:
		if (execution.flags.get(ExecutionModeQuads))
			inputs.push_back("quads");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeIsolines))
			inputs.push_back("isolines");
		if (execution.flags.get(ExecutionModePointMode))
			inputs.push_back("point_mode");

		if (!execution.flags.get(ExecutionModeIsolines))
		{
			if (execution.flags.get(ExecutionModeVertexOrderCw))
				inputs.push_back("cw");
			if (execution.flags.get(ExecutionModeVertexOrderCcw))
				inputs.push_back("ccw");
		}

		if (execution.flags.get(ExecutionModeSpacingFractionalEven))
			inputs.push_back("fractional_even_spacing");
		if (execution.flags.get(ExecutionModeSpacingFractionalOdd))
			inputs.push_back("fractional_odd_spacing");
		if (execution.flags.get(ExecutionModeSpacingEqual))
			inputs.push_back("equal_spacing");
		break;

	case ExecutionModelGLCompute:
	case ExecutionModelTaskEXT:
	case ExecutionModelMeshEXT:
	{
		if (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId))
		{
			SpecializationConstant wg_x, wg_y, wg_z;
			get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

			// If there are any spec constants on legacy GLSL, defer declaration, we need to set up macro
			// declarations before we can emit the work group size.
			if (options.vulkan_semantics ||
			    ((wg_x.id == ConstantID(0)) && (wg_y.id == ConstantID(0)) && (wg_z.id == ConstantID(0))))
				build_workgroup_size(inputs, wg_x, wg_y, wg_z);
		}
		else
		{
			inputs.push_back(join("local_size_x = ", execution.workgroup_size.x));
			inputs.push_back(join("local_size_y = ", execution.workgroup_size.y));
			inputs.push_back(join("local_size_z = ", execution.workgroup_size.z));
		}

		if (execution.model == ExecutionModelMeshEXT)
		{
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			outputs.push_back(join("max_primitives = ", execution.output_primitives));
			if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
				outputs.push_back("triangles");
			else if (execution.flags.get(ExecutionModeOutputLinesEXT))
				outputs.push_back("lines");
			else if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
		}
		break;
	}

	case ExecutionModelFragment:
		if (options.es)
		{
			switch (options.fragment.default_float_precision)
			{
			case Options::Lowp:
				statement("precision lowp float;");
				break;

			case Options::Mediump:
				statement("precision mediump float;");
				break;

			case Options::Highp:
				statement("precision highp float;");
				break;

			default:
				break;
			}

			switch (options.fragment.default_int_precision)
			{
			case Options::Lowp:
				statement("precision lowp int;");
				break;

			case Options::Mediump:
				statement("precision mediump int;");
				break;

			case Options::Highp:
				statement("precision highp int;");
				break;

			default:
				break;
			}
		}

		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			inputs.push_back("early_fragment_tests");
		if (execution.flags.get(ExecutionModePostDepthCoverage))
			inputs.push_back("post_depth_coverage");

		if (interlock_used)
			statement("#if defined(GL_ARB_fragment_shader_interlock)");

		if (execution.flags.get(ExecutionModePixelInterlockOrderedEXT))
			statement("layout(pixel_interlock_ordered) in;");
		else if (execution.flags.get(ExecutionModePixelInterlockUnorderedEXT))
			statement("layout(pixel_interlock_unordered) in;");
		else if (execution.flags.get(ExecutionModeSampleInterlockOrderedEXT))
			statement("layout(sample_interlock_ordered) in;");
		else if (execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT))
			statement("layout(sample_interlock_unordered) in;");

		if (interlock_used)
		{
			statement("#elif !defined(GL_INTEL_fragment_shader_ordering)");
			statement("#error Fragment Shader Interlock/Ordering extension missing!");
			statement("#endif");
		}

		if (!options.es && execution.flags.get(ExecutionModeDepthGreater))
			statement("layout(depth_greater) out float gl_FragDepth;");
		else if (!options.es && execution.flags.get(ExecutionModeDepthLess))
			statement("layout(depth_less) out float gl_FragDepth;");

		break;

	default:
		break;
	}

	for (auto &cap : ir.declared_capabilities)
		if (cap == CapabilityRayTraversalPrimitiveCullingKHR)
			statement("layout(primitive_culling);");

	if (!inputs.empty())
		statement("layout(", merge(inputs), ") in;");
	if (!outputs.empty())
		statement("layout(", merge(outputs), ") out;");

	statement("");
}